

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

ARKInterp arkInterpCreate_Hermite(ARKodeMem_conflict ark_mem,int degree)

{
  ARKInterpOps __ptr;
  int *__s;
  int in_ESI;
  long in_RDI;
  ARKInterpOps ops;
  ARKInterpContent_Hermite content;
  ARKInterp interp;
  int local_34;
  ARKInterp local_8;
  
  if ((in_ESI < 0) || (5 < in_ESI)) {
    local_8 = (ARKInterp)0x0;
  }
  else {
    local_8 = (ARKInterp)malloc(0x10);
    if (local_8 == (ARKInterp)0x0) {
      local_8 = (ARKInterp)0x0;
    }
    else {
      __ptr = (ARKInterpOps)malloc(0x38);
      if (__ptr == (ARKInterpOps)0x0) {
        free(local_8);
        local_8 = (ARKInterp)0x0;
      }
      else {
        __ptr->resize = arkInterpResize_Hermite;
        __ptr->free = arkInterpFree_Hermite;
        __ptr->print = arkInterpPrintMem_Hermite;
        __ptr->setdegree = arkInterpSetDegree_Hermite;
        __ptr->init = arkInterpInit_Hermite;
        __ptr->update = arkInterpUpdate_Hermite;
        __ptr->evaluate = arkInterpEvaluate_Hermite;
        __s = (int *)malloc(0x40);
        if (__s == (int *)0x0) {
          free(__ptr);
          free(local_8);
          local_8 = (ARKInterp)0x0;
        }
        else {
          memset(__s,0,0x40);
          local_8->ops = __ptr;
          local_8->content = __s;
          __s[2] = 0;
          __s[3] = 0;
          __s[4] = 0;
          __s[5] = 0;
          __s[6] = 0;
          __s[7] = 0;
          __s[8] = 0;
          __s[9] = 0;
          local_34 = in_ESI;
          if (5 < in_ESI) {
            local_34 = 5;
          }
          *__s = local_34;
          *(long *)(in_RDI + 0x348) = *(long *)(in_RDI + 0x348) + 2;
          *(long *)(in_RDI + 0x350) = *(long *)(in_RDI + 0x350) + 5;
          *(undefined8 *)(__s + 10) = *(undefined8 *)(in_RDI + 0x2d0);
          *(undefined8 *)(__s + 0xc) = *(undefined8 *)(in_RDI + 0x2d0);
          __s[0xe] = 0;
          __s[0xf] = 0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKInterp arkInterpCreate_Hermite(ARKodeMem ark_mem, int degree)
{
  ARKInterp interp;
  ARKInterpContent_Hermite content;
  ARKInterpOps ops;

  /* check for valid degree */
  if (degree < 0 || degree > ARK_INTERP_MAX_DEGREE) { return (NULL); }

  /* allocate overall structure */
  interp = NULL;
  interp = (ARKInterp)malloc(sizeof *interp);
  if (interp == NULL) { return (NULL); }

  /* allocate ops structure and set entries */
  ops = NULL;
  ops = (ARKInterpOps)malloc(sizeof *ops);
  if (ops == NULL)
  {
    free(interp);
    return (NULL);
  }
  ops->resize    = arkInterpResize_Hermite;
  ops->free      = arkInterpFree_Hermite;
  ops->print     = arkInterpPrintMem_Hermite;
  ops->setdegree = arkInterpSetDegree_Hermite;
  ops->init      = arkInterpInit_Hermite;
  ops->update    = arkInterpUpdate_Hermite;
  ops->evaluate  = arkInterpEvaluate_Hermite;

  /* create content, and initialize everything to zero/NULL */
  content = NULL;
  content = (ARKInterpContent_Hermite)malloc(sizeof *content);
  if (content == NULL)
  {
    free(ops);
    free(interp);
    return (NULL);
  }
  memset(content, 0, sizeof(struct _ARKInterpContent_Hermite));

  /* attach ops and content structures to overall structure */
  interp->ops     = ops;
  interp->content = content;

  /* fill content */

  /* initialize local N_Vectors to NULL */
  content->fold = NULL;
  content->yold = NULL;
  content->fa   = NULL;
  content->fb   = NULL;

  /* set maximum interpolant degree */
  content->degree = SUNMIN(ARK_INTERP_MAX_DEGREE, degree);

  /* update workspace sizes */
  ark_mem->lrw += 2;
  ark_mem->liw += 5;

  /* initialize time values */
  content->told = ark_mem->tcur;
  content->tnew = ark_mem->tcur;
  content->h    = SUN_RCONST(0.0);

  return (interp);
}